

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

string * __thiscall
kratos::expr_to_string_abi_cxx11_
          (string *__return_storage_ptr__,kratos *this,Expr *expr,bool is_top,bool use_handle,
          bool ignore_top,Generator *scope)

{
  Var *this_00;
  bool bVar1;
  VarType VVar2;
  element_type *peVar3;
  element_type *peVar4;
  undefined7 in_register_00000009;
  remove_reference_t<std::__cxx11::basic_string<char>_> *args;
  char (*extraout_RDX) [6];
  char (*extraout_RDX_00) [6];
  char (*extraout_RDX_01) [6];
  char (*format_str) [6];
  ExprOp extraout_RDX_02;
  ExprOp extraout_RDX_03;
  ExprOp extraout_RDX_04;
  ExprOp extraout_RDX_05;
  ExprOp extraout_RDX_06;
  ExprOp extraout_RDX_07;
  ExprOp extraout_RDX_08;
  ExprOp extraout_RDX_09;
  ExprOp extraout_RDX_10;
  ExprOp extraout_RDX_11;
  ExprOp extraout_RDX_12;
  ExprOp extraout_RDX_13;
  ExprOp EVar5;
  string *args_1;
  undefined7 in_register_00000089;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  args_2;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  string_view format_str_03;
  string_view format_str_04;
  Generator *in_stack_fffffffffffffae8;
  string local_480;
  string local_460;
  string local_440;
  undefined4 local_41c;
  string local_418;
  byte local_3f1;
  undefined1 local_3f0 [24];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [8];
  string right_str;
  undefined1 local_3a0 [24];
  undefined1 local_388 [16];
  undefined1 local_378 [8];
  string left_str;
  Var *right;
  Var *left;
  v7 local_338 [32];
  undefined1 local_318 [8];
  Generator *scope_local;
  bool ignore_top_local;
  bool use_handle_local;
  kratos *pkStack_308;
  bool is_top_local;
  Expr *expr_local;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_2f8;
  basic_string_view<char> local_2e8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_2d8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_2c8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  __node_base_ptr local_2b8;
  __node_base local_2b0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_2a8;
  basic_string_view<char> local_298;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_288;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_258;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_1;
  __node_base local_248;
  undefined1 local_240 [16];
  string *local_230;
  undefined1 local_228 [16];
  basic_string_view<char> local_218;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_208;
  undefined1 local_1d8 [8];
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_2;
  undefined8 local_1c8;
  _Base_ptr local_1c0;
  char *local_1b8 [2];
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_1a8;
  _Prime_rehash_policy local_198;
  _Rb_tree_node_base local_188;
  _Rb_tree_node_base *local_160;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_3;
  string *local_150;
  char *local_148;
  __node_base local_140;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_138;
  basic_string_view<char> local_128;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_f8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_4;
  string *local_e8;
  char *local_e0;
  string *local_d8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_d0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_c8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_c0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_b8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_b0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_a8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_a0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_98;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_90;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_88;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_80;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_78;
  _Rb_tree_node_base *local_70;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_68;
  _Rb_tree_node_base *local_60;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_58;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_50;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_48;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_40;
  _Rb_tree_node_base *local_38;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  args_2._1_7_ = in_register_00000089;
  args_2._0_1_ = ignore_top;
  scope_local._7_1_ = (byte)expr & 1;
  args = (remove_reference_t<std::__cxx11::basic_string<char>_> *)
         (CONCAT71(in_register_00000009,is_top) & 0xffffffffffffff01);
  scope_local._6_1_ = (byte)args;
  args_1 = __return_storage_ptr__;
  local_318 = (undefined1  [8])args_2;
  scope_local._5_1_ = use_handle;
  pkStack_308 = this;
  expr_local = (Expr *)__return_storage_ptr__;
  bVar1 = is_expand_op(*(ExprOp *)(this + 0x270));
  if (bVar1) {
    if ((scope_local._6_1_ & 1) == 0) {
      if (local_318 == (undefined1  [8])0x0) {
        (**(code **)(*(long *)pkStack_308 + 0xf8))(__return_storage_ptr__);
      }
      else {
        (**(code **)(*(long *)pkStack_308 + 0x110))(__return_storage_ptr__,pkStack_308,local_318);
      }
    }
    else {
      (**(code **)(*(long *)pkStack_308 + 0x108))
                (__return_storage_ptr__,pkStack_308,scope_local._5_1_ & 1);
    }
  }
  else if (*(long *)(pkStack_308 + 0x270) == 0x1b) {
    if ((scope_local._6_1_ & 1) == 0) {
      if (local_318 == (undefined1  [8])0x0) {
        (**(code **)(*(long *)pkStack_308 + 0xf8))(local_338);
        format_str = extraout_RDX_01;
      }
      else {
        (**(code **)(*(long *)pkStack_308 + 0x110))(local_338,pkStack_308,local_318);
        format_str = extraout_RDX_00;
      }
    }
    else {
      args = (remove_reference_t<std::__cxx11::basic_string<char>_> *)
             (CONCAT71((int7)((ulong)args >> 8),scope_local._5_1_) & 0xffffffffffffff01);
      (**(code **)(*(long *)pkStack_308 + 0x108))(local_338,pkStack_308,scope_local._5_1_ & 1);
      format_str = extraout_RDX;
    }
    local_2b8 = (__node_base_ptr)0x428e2e;
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_338;
    local_2b0._M_nxt = (_Hash_node_base *)__return_storage_ptr__;
    local_2d8.named_args.data =
         (named_arg_info<char> *)
         fmt::v7::make_args_checked<std::__cxx11::string,char[6],char>
                   ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x428e2e,(v7 *)vargs,format_str,args);
    local_2c8 = &local_2d8;
    local_2e8 = fmt::v7::to_string_view<char,_0>((char *)local_2b8);
    local_28 = &local_2f8;
    local_30 = local_2c8;
    local_20 = local_2c8;
    local_10 = local_2c8;
    local_18 = local_28;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_28,0xd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)&local_2c8->string);
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = args_2.values_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_2f8.field_1.values_;
    format_str_00.size_ = local_2f8.desc_;
    format_str_00.data_ = (char *)local_2e8.size_;
    fmt::v7::detail::vformat_abi_cxx11_
              (__return_storage_ptr__,(detail *)local_2e8.data_,format_str_00,args_00);
    std::__cxx11::string::~string((string *)local_338);
  }
  else {
    this_00 = *(Var **)(pkStack_308 + 0x278);
    left_str.field_2._8_8_ = *(undefined8 *)(pkStack_308 + 0x280);
    VVar2 = Var::type(this_00);
    local_3a0[0x17] = 0;
    right_str.field_2._M_local_buf[0xf] = '\0';
    if (VVar2 == Expression) {
      Var::as<kratos::Expr>((Var *)local_388);
      local_3a0[0x17] = 1;
      peVar3 = std::__shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2> *)local_388);
      EVar5 = *(ExprOp *)(pkStack_308 + 0x270);
      Var::as<kratos::Expr>((Var *)local_3a0);
      right_str.field_2._M_local_buf[0xf] = '\x01';
      peVar4 = std::__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_3a0);
      args_1 = (string *)(ulong)(scope_local._5_1_ & 1);
      args_2 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                )local_318;
      expr_to_string_abi_cxx11_
                ((string *)local_378,(kratos *)peVar3,(Expr *)(ulong)(EVar5 == peVar4->op),
                 (bool)(scope_local._6_1_ & 1),SUB41(scope_local._5_1_ & 1,0),local_318[0],
                 in_stack_fffffffffffffae8);
      EVar5 = extraout_RDX_02;
    }
    else if ((scope_local._6_1_ & 1) == 0) {
      if (local_318 == (undefined1  [8])0x0) {
        (*(this_00->super_IRNode)._vptr_IRNode[0x1f])(local_378);
        EVar5 = extraout_RDX_05;
      }
      else {
        (*(this_00->super_IRNode)._vptr_IRNode[0x22])(local_378,this_00,local_318);
        EVar5 = extraout_RDX_04;
      }
    }
    else {
      (*(this_00->super_IRNode)._vptr_IRNode[0x21])
                (local_378,this_00,(ulong)(scope_local._5_1_ & 1));
      EVar5 = extraout_RDX_03;
    }
    if ((right_str.field_2._M_local_buf[0xf] & 1U) != 0) {
      std::shared_ptr<kratos::Expr>::~shared_ptr((shared_ptr<kratos::Expr> *)local_3a0);
      EVar5 = extraout_RDX_06;
    }
    if ((local_3a0[0x17] & 1) != 0) {
      std::shared_ptr<kratos::Expr>::~shared_ptr((shared_ptr<kratos::Expr> *)local_388);
      EVar5 = extraout_RDX_07;
    }
    if (left_str.field_2._8_8_ == 0) {
      if ((scope_local._7_1_ & 1) == 0) {
        ExprOpStr_abi_cxx11_(&local_480,*(kratos **)(pkStack_308 + 0x270),EVar5);
        local_e0 = "({0}{1})";
        local_e8 = &local_480;
        vargs_4 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_378;
        local_d8 = __return_storage_ptr__;
        fmt::v7::make_args_checked<std::__cxx11::string,std::__cxx11::string&,char[9],char>
                  (&local_118,(v7 *)"({0}{1})",(char (*) [9])local_e8,
                   (remove_reference_t<std::__cxx11::basic_string<char>_> *)vargs_4,args_1);
        local_f8 = &local_118;
        local_128 = fmt::v7::to_string_view<char,_0>(local_e0);
        local_78 = &local_138;
        local_80 = local_f8;
        local_50 = local_f8;
        local_40 = local_f8;
        local_48 = local_78;
        fmt::v7::
        basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        ::basic_format_args(local_78,0xdd,
                            (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                             *)local_f8);
        args_04.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.values_ = args_2.values_;
        args_04.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)local_138.field_1.values_;
        format_str_04.size_ = local_138.desc_;
        format_str_04.data_ = (char *)local_128.size_;
        fmt::v7::detail::vformat_abi_cxx11_
                  (__return_storage_ptr__,(detail *)local_128.data_,format_str_04,args_04);
        std::__cxx11::string::~string((string *)&local_480);
        local_41c = 1;
      }
      else {
        ExprOpStr_abi_cxx11_(&local_460,*(kratos **)(pkStack_308 + 0x270),EVar5);
        local_148 = "{0}{1}";
        local_150 = &local_460;
        vargs_3 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_378;
        local_140._M_nxt = (_Hash_node_base *)__return_storage_ptr__;
        fmt::v7::make_args_checked<std::__cxx11::string,std::__cxx11::string&,char[7],char>
                  ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_188,(v7 *)"{0}{1}",(char (*) [7])local_150,
                   (remove_reference_t<std::__cxx11::basic_string<char>_> *)vargs_3,args_1);
        local_160 = &local_188;
        local_198 = (_Prime_rehash_policy)fmt::v7::to_string_view<char,_0>(local_148);
        local_68 = &local_1a8;
        local_70 = local_160;
        local_60 = local_160;
        local_38 = local_160;
        local_58 = local_68;
        fmt::v7::
        basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        ::basic_format_args(local_68,0xdd,
                            (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                             *)local_160);
        args_03.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.values_ = args_2.values_;
        args_03.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)local_1a8.field_1.values_;
        format_str_03.size_ = local_1a8.desc_;
        format_str_03.data_ = (char *)local_198._M_next_resize;
        fmt::v7::detail::vformat_abi_cxx11_
                  (__return_storage_ptr__,(detail *)local_198._0_8_,format_str_03,args_03);
        std::__cxx11::string::~string((string *)&local_460);
        local_41c = 1;
      }
    }
    else {
      VVar2 = Var::type((Var *)left_str.field_2._8_8_);
      local_3f0[0x17] = 0;
      local_3f1 = 0;
      if (VVar2 == Expression) {
        Var::as<kratos::Expr>((Var *)local_3d8);
        local_3f0[0x17] = 1;
        peVar3 = std::__shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>::get
                           ((__shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2> *)local_3d8);
        EVar5 = *(ExprOp *)(pkStack_308 + 0x270);
        Var::as<kratos::Expr>((Var *)local_3f0);
        local_3f1 = 1;
        peVar4 = std::__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_3f0);
        args_2 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                  )local_318;
        expr_to_string_abi_cxx11_
                  ((string *)local_3c8,(kratos *)peVar3,(Expr *)(ulong)(EVar5 == peVar4->op),
                   (bool)(scope_local._6_1_ & 1),(bool)(scope_local._5_1_ & 1),local_318[0],
                   in_stack_fffffffffffffae8);
        EVar5 = extraout_RDX_08;
      }
      else if ((scope_local._6_1_ & 1) == 0) {
        if (local_318 == (undefined1  [8])0x0) {
          (**(code **)(*(long *)left_str.field_2._8_8_ + 0xf8))(local_3c8);
          EVar5 = extraout_RDX_11;
        }
        else {
          (**(code **)(*(long *)left_str.field_2._8_8_ + 0x110))
                    (local_3c8,left_str.field_2._8_8_,local_318);
          EVar5 = extraout_RDX_10;
        }
      }
      else {
        (**(code **)(*(long *)left_str.field_2._8_8_ + 0x108))
                  (local_3c8,left_str.field_2._8_8_,scope_local._5_1_ & 1);
        EVar5 = extraout_RDX_09;
      }
      if ((local_3f1 & 1) != 0) {
        std::shared_ptr<kratos::Expr>::~shared_ptr((shared_ptr<kratos::Expr> *)local_3f0);
        EVar5 = extraout_RDX_12;
      }
      if ((local_3f0[0x17] & 1) != 0) {
        std::shared_ptr<kratos::Expr>::~shared_ptr((shared_ptr<kratos::Expr> *)local_3d8);
        EVar5 = extraout_RDX_13;
      }
      if ((scope_local._7_1_ & 1) == 0) {
        ExprOpStr_abi_cxx11_(&local_440,*(kratos **)(pkStack_308 + 0x270),EVar5);
        local_1b8[0] = "({0} {1} {2})";
        local_1c0 = (_Base_ptr)local_378;
        local_1c8 = &local_440;
        vargs_2 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_3c8;
        local_1b8[1] = (char *)__return_storage_ptr__;
        fmt::v7::
        make_args_checked<std::__cxx11::string&,std::__cxx11::string,std::__cxx11::string&,char[14],char>
                  (&local_208,(v7 *)"({0} {1} {2})",(char (*) [14])local_1c0,
                   (remove_reference_t<std::__cxx11::basic_string<char>_&> *)local_1c8,
                   (remove_reference_t<std::__cxx11::basic_string<char>_> *)vargs_2,
                   (remove_reference_t<std::__cxx11::basic_string<char>_&> *)args_2.values_);
        local_1d8 = (undefined1  [8])&local_208;
        local_218 = fmt::v7::to_string_view<char,_0>(local_1b8[0]);
        local_c8 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                    *)local_228;
        local_d0 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_1d8;
        local_a0 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_1d8;
        local_90 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_1d8;
        local_98 = local_c8;
        fmt::v7::
        basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        ::basic_format_args(local_c8,0xddd,
                            (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                             *)local_1d8);
        args_02.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.values_ = args_2.values_;
        args_02.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = local_228._8_8_;
        format_str_02.size_ = local_228._0_8_;
        format_str_02.data_ = (char *)local_218.size_;
        fmt::v7::detail::vformat_abi_cxx11_
                  (__return_storage_ptr__,(detail *)local_218.data_,format_str_02,args_02);
        std::__cxx11::string::~string((string *)&local_440);
      }
      else {
        ExprOpStr_abi_cxx11_(&local_418,*(kratos **)(pkStack_308 + 0x270),EVar5);
        local_240._8_8_ = "{0} {1} {2}";
        local_240._0_8_ = local_378;
        local_248._M_nxt = (_Hash_node_base *)&local_418;
        vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_3c8;
        local_230 = __return_storage_ptr__;
        fmt::v7::
        make_args_checked<std::__cxx11::string&,std::__cxx11::string,std::__cxx11::string&,char[12],char>
                  (&local_288,(v7 *)"{0} {1} {2}",(char (*) [12])local_240._0_8_,
                   (remove_reference_t<std::__cxx11::basic_string<char>_&> *)local_248._M_nxt,
                   (remove_reference_t<std::__cxx11::basic_string<char>_> *)vargs_1,
                   (remove_reference_t<std::__cxx11::basic_string<char>_&> *)args_2.values_);
        local_258 = &local_288;
        local_298 = fmt::v7::to_string_view<char,_0>((char *)local_240._8_8_);
        local_b8 = &local_2a8;
        local_c0 = local_258;
        local_b0 = local_258;
        local_88 = local_258;
        local_a8 = local_b8;
        fmt::v7::
        basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        ::basic_format_args(local_b8,0xddd,
                            (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                             *)local_258);
        args_01.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.values_ = args_2.values_;
        args_01.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)local_2a8.field_1.values_;
        format_str_01.size_ = local_2a8.desc_;
        format_str_01.data_ = (char *)local_298.size_;
        fmt::v7::detail::vformat_abi_cxx11_
                  (__return_storage_ptr__,(detail *)local_298.data_,format_str_01,args_01);
        std::__cxx11::string::~string((string *)&local_418);
      }
      local_41c = 1;
      std::__cxx11::string::~string((string *)local_3c8);
    }
    std::__cxx11::string::~string((string *)local_378);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string inline expr_to_string(const Expr *expr, bool is_top, bool use_handle,
                                  bool ignore_top = false, Generator *scope = nullptr) {
    // overloaded to_string methods?
    if (is_expand_op(expr->op))
        return use_handle ? expr->handle_name(ignore_top)
               : scope    ? expr->handle_name(scope)
                          : expr->to_string();
    if (expr->op == ExprOp::Conditional)
        return ::format("({0})", use_handle ? expr->handle_name(ignore_top)
                                 : scope    ? expr->handle_name(scope)
                                            : expr->to_string());

    auto *left = expr->left;
    auto *right = expr->right;

    auto left_str = left->type() == VarType::Expression
                        ? expr_to_string(left->as<Expr>().get(), expr->op == left->as<Expr>()->op,
                                         use_handle, ignore_top, scope)
                        : (use_handle ? left->handle_name(ignore_top)
                           : scope    ? left->handle_name(scope)
                                      : left->to_string());

    if (right != nullptr) {
        auto right_str =
            right->type() == VarType::Expression
                ? expr_to_string(right->as<Expr>().get(), expr->op == right->as<Expr>()->op,
                                 use_handle, ignore_top, scope)
                : (use_handle ? right->handle_name(ignore_top)
                   : scope    ? right->handle_name(scope)
                              : right->to_string());
        if (is_top)
            return ::format("{0} {1} {2}", left_str, ExprOpStr(expr->op), right_str);
        else
            return ::format("({0} {1} {2})", left_str, ExprOpStr(expr->op), right_str);
    } else {
        if (is_top)
            return ::format("{0}{1}", ExprOpStr(expr->op), left_str);
        else
            return ::format("({0}{1})", ExprOpStr(expr->op), left_str);
    }
}